

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O2

void bt_skip_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
                 uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size)

{
  byte bVar1;
  uint uVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  uint uVar5;
  uint32_t *puVar6;
  byte bVar7;
  uint uVar8;
  uint32_t uVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  
  puVar6 = son + cyclic_pos * 2;
  uVar5 = 0;
  uVar8 = 0;
  puVar3 = son + (ulong)(cyclic_pos * 2) + 1;
  while ((bVar12 = depth != 0, depth = depth - 1, bVar12 &&
         (uVar2 = pos - cur_match, uVar2 < cyclic_size))) {
    uVar9 = 0;
    if (cyclic_pos < uVar2) {
      uVar9 = cyclic_size;
    }
    uVar10 = uVar8;
    if (uVar5 < uVar8) {
      uVar10 = uVar5;
    }
    uVar11 = (ulong)uVar10;
    puVar4 = son + ((cyclic_pos - uVar2) + uVar9) * 2;
    bVar1 = cur[uVar11];
    bVar7 = cur[uVar11 - uVar2];
    while (uVar10 = (uint)uVar11, bVar7 == bVar1) {
      if (len_limit - 1 == uVar10) {
        *puVar6 = *puVar4;
        *puVar3 = puVar4[1];
        return;
      }
      uVar11 = (ulong)(uVar10 + 1);
      bVar1 = cur[uVar11];
      bVar7 = cur[uVar11 - uVar2];
    }
    if (bVar7 < bVar1) {
      *puVar6 = cur_match;
      puVar6 = puVar4 + 1;
      puVar4 = puVar3;
      puVar3 = puVar6;
      uVar8 = uVar10;
    }
    else {
      *puVar3 = cur_match;
      puVar3 = puVar4;
      uVar5 = uVar10;
    }
    cur_match = *puVar3;
    puVar3 = puVar4;
  }
  *puVar3 = 0;
  *puVar6 = 0;
  return;
}

Assistant:

static void
bt_skip_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size)
{
	uint32_t *ptr0 = son + (cyclic_pos << 1) + 1;
	uint32_t *ptr1 = son + (cyclic_pos << 1);

	uint32_t len0 = 0;
	uint32_t len1 = 0;

	while (true) {
		uint32_t *pair;
		const uint8_t *pb;
		uint32_t len;

		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size) {
			*ptr0 = EMPTY_HASH_VALUE;
			*ptr1 = EMPTY_HASH_VALUE;
			return;
		}

		pair = son + ((cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0))
				<< 1);
		pb = cur - delta;
		len = my_min(len0, len1);

		if (pb[len] == cur[len]) {
			while (++len != len_limit)
				if (pb[len] != cur[len])
					break;

			if (len == len_limit) {
				*ptr1 = pair[0];
				*ptr0 = pair[1];
				return;
			}
		}

		if (pb[len] < cur[len]) {
			*ptr1 = cur_match;
			ptr1 = pair + 1;
			cur_match = *ptr1;
			len1 = len;
		} else {
			*ptr0 = cur_match;
			ptr0 = pair;
			cur_match = *ptr0;
			len0 = len;
		}
	}
}